

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

char * spovar2str(long spovar)

{
  ulong uVar1;
  undefined *puVar2;
  char *pcVar3;
  
  uVar1 = (spovar & 0xffffffffffffffbfU) - 1;
  if (uVar1 < 8) {
    puVar2 = &DAT_00116264 + *(int *)(&DAT_00116264 + uVar1 * 4);
  }
  else {
    puVar2 = (undefined *)0x0;
    lc_error("spovar2str(%li)");
  }
  spovar2str::togl = ~spovar2str::togl & 1;
  pcVar3 = " array";
  if ((spovar & 0x40U) == 0) {
    pcVar3 = "";
  }
  snprintf(spovar2str::buf[0] + (uint)(spovar2str::togl << 7),0x7f,"%s%s",puVar2,pcVar3);
  return spovar2str::buf[(uint)spovar2str::togl];
}

Assistant:

static const char *spovar2str(long spovar)
{
	static int togl = 0;
	static char buf[2][128];
	char *n = NULL;
	int is_array = (spovar & SPOVAR_ARRAY);
	spovar &= ~SPOVAR_ARRAY;

	switch (spovar) {
	default:		lc_error("spovar2str(%li)", spovar); break;
	case SPOVAR_INT:	n = "integer"; break;
	case SPOVAR_STRING:	n = "string"; break;
	case SPOVAR_VARIABLE:	n = "variable"; break;
	case SPOVAR_COORD:	n = "coordinate"; break;
	case SPOVAR_REGION:	n = "region"; break;
	case SPOVAR_MAPCHAR:	n = "mapchar"; break;
	case SPOVAR_MONST:	n = "monster"; break;
	case SPOVAR_OBJ:	n = "object"; break;
	}

	togl = (togl + 1) % 2;

	snprintf(buf[togl], 127, "%s%s", n, (is_array ? " array" : ""));
	return buf[togl];
}